

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events_cpp.cpp
# Opt level: O0

void __thiscall Events::resize(Events *this,mfb_window *window,int width,int height)

{
  uint in_ECX;
  uint in_EDX;
  mfb_window *in_RSI;
  char *window_title;
  uint32_t y;
  uint32_t x;
  char *pcVar1;
  uint offset_y;
  uint offset_x;
  
  offset_x = 0;
  offset_y = 0;
  pcVar1 = "";
  if (in_RSI != (mfb_window *)0x0) {
    pcVar1 = (char *)mfb_get_user_data(in_RSI);
  }
  fprintf(_stdout,"%s > resize: %d, %d\n",pcVar1,(ulong)in_EDX,(ulong)in_ECX);
  if (800 < (int)in_EDX) {
    offset_x = (int)(in_EDX - 800) >> 1;
    in_EDX = 800;
  }
  if (600 < (int)in_ECX) {
    offset_y = (int)(in_ECX - 600) >> 1;
    in_ECX = 600;
  }
  mfb_set_viewport((mfb_window *)CONCAT44(in_EDX,in_ECX),offset_x,offset_y,
                   (uint)((ulong)pcVar1 >> 0x20),(uint)pcVar1);
  return;
}

Assistant:

void resize(struct mfb_window *window, int width, int height) {
        uint32_t x = 0;
        uint32_t y = 0;
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }

        fprintf(stdout, "%s > resize: %d, %d\n", window_title, width, height);
        if(width > WIDTH) {
            x = (width - WIDTH) >> 1;
            width = WIDTH;
        }
        if(height > HEIGHT) {
            y = (height - HEIGHT) >> 1;
            height = HEIGHT;
        }
        mfb_set_viewport(window, x, y, width, height);
    }